

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O0

void amrex::single_level_redistribute
               (MultiFab *div_tmp_in,MultiFab *div_out,int div_comp,int ncomp,Geometry *geom)

{
  int iVar1;
  FabArrayBase *in_RSI;
  FabArrayBase *in_RDI;
  MultiFab weights;
  undefined1 *val;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe10;
  undefined8 *puVar2;
  DistributionMapping *in_stack_fffffffffffffe20;
  BoxArray *in_stack_fffffffffffffe28;
  MultiFab *this;
  undefined8 local_1c8;
  FabFactory<amrex::FArrayBox> *factory;
  Geometry *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  MultiFab *in_stack_ffffffffffffffb8;
  MultiFab *in_stack_ffffffffffffffc0;
  MultiFab *in_stack_ffffffffffffffc8;
  
  FabArrayBase::boxArray(in_RSI);
  FabArrayBase::DistributionMap(in_RSI);
  iVar1 = FabArrayBase::nGrow(in_RDI,0);
  local_1c8 = 0;
  factory = (FabFactory<amrex::FArrayBox> *)0x0;
  puVar2 = &local_1c8;
  MFInfo::MFInfo((MFInfo *)0x118dc19);
  this = (MultiFab *)0x0;
  val = &stack0xfffffffffffffe30;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffdf0);
  MultiFab::MultiFab(this,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                     (int)((ulong)puVar2 >> 0x20),(int)puVar2,
                     (MFInfo *)CONCAT44(iVar1,in_stack_fffffffffffffe10),factory);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x118dc6b);
  MFInfo::~MFInfo((MFInfo *)0x118dc75);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(in_stack_fffffffffffffdf0,(value_type)val)
  ;
  single_level_weighted_redistribute
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  MultiFab::~MultiFab((MultiFab *)0x118dcc6);
  return;
}

Assistant:

void single_level_redistribute (MultiFab& div_tmp_in, MultiFab& div_out,
                                    int div_comp, int ncomp, const Geometry& geom)
    {
        // We create a weighting array to use inside the redistribution array
        MultiFab weights(div_out.boxArray(), div_out.DistributionMap(), 1, div_tmp_in.nGrow());
        weights.setVal(1.0);

        single_level_weighted_redistribute (div_tmp_in, div_out, weights, div_comp, ncomp, geom);
    }